

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interlink.cpp
# Opt level: O2

void __thiscall indk::Interlink::doUpdateStructure(Interlink *this,string *data)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"io_app_update_structure",&local_39);
  doSend(this,&local_38,data);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void indk::Interlink::doUpdateStructure(const std::string &data) {
    doSend("io_app_update_structure", data);
}